

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStruct
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IDLOptions *pIVar1;
  char *__s;
  allocator<char> local_2c1;
  string local_2c0;
  anon_class_32_4_a0854209 local_2a0;
  function<void_()> local_280;
  anon_class_8_1_72ac95b1 local_260;
  function<void_()> local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  anon_class_8_1_72ac95b1 local_1c8;
  function<void_()> local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  IDLOptions *pIStack_28;
  bool fixed;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    pIStack_28 = options;
    options_local = (IDLOptions *)writer;
    writer_local = (CodeWriter *)struct_def;
    struct_def_local = (StructDef *)this;
    GenerateComment(this,&(struct_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    pIVar1 = options_local;
    local_29 = writer_local->field_0x110 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"struct_name",&local_51);
    IdlNamer::Type_abi_cxx11_(&local_88,&this->namer_,(StructDef *)writer_local);
    CodeWriter::SetValue((CodeWriter *)pIVar1,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pIVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"superclass",&local_a9);
    __s = "Table";
    if ((local_29 & 1) != 0) {
      __s = "Struct";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s,&local_d1);
    CodeWriter::SetValue((CodeWriter *)pIVar1,&local_a8,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"@Suppress(\"unused\")",&local_f9);
    CodeWriter::operator+=((CodeWriter *)options_local,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"class {{struct_name}} : {{superclass}}() {\n",&local_121);
    CodeWriter::operator+=((CodeWriter *)options_local,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    CodeWriter::IncrementIdentLevel((CodeWriter *)options_local);
    pIVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"__init",&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"_i: Int, _bb: ByteBuffer",&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
    local_1c8.writer = (CodeWriter *)options_local;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenStruct(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
              ((function<void()> *)&local_1c0,&local_1c8);
    GenerateFun((CodeWriter *)pIVar1,&local_148,&local_170,&local_198,&local_1c0,false);
    std::function<void_()>::~function(&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    pIVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"__assign",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"_i: Int, _bb: ByteBuffer",&local_211);
    IdlNamer::Type_abi_cxx11_(&local_238,&this->namer_,(StructDef *)writer_local);
    local_260.writer = (CodeWriter *)options_local;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenStruct(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_2_,void>
              ((function<void()> *)&local_258,&local_260);
    GenerateFun((CodeWriter *)pIVar1,&local_1e8,&local_210,&local_238,&local_258,false);
    std::function<void_()>::~function(&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    GenerateStructGetters(this,(StructDef *)writer_local,(CodeWriter *)options_local);
    pIVar1 = options_local;
    local_2a0.struct_def = (StructDef *)writer_local;
    local_2a0.writer = (CodeWriter *)options_local;
    local_2a0.options = options;
    local_2a0.this = this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenStruct(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_3_,void>
              ((function<void()> *)&local_280,&local_2a0);
    GenerateCompanionObject(this,(CodeWriter *)pIVar1,&local_280);
    std::function<void_()>::~function(&local_280);
    CodeWriter::DecrementIdentLevel((CodeWriter *)options_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"}",&local_2c1);
    CodeWriter::operator+=((CodeWriter *)options_local,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  return;
}

Assistant:

void GenStruct(StructDef &struct_def, CodeWriter &writer,
                 IDLOptions options) const {
    if (struct_def.generated) return;

    GenerateComment(struct_def.doc_comment, writer, &comment_config);
    auto fixed = struct_def.fixed;

    writer.SetValue("struct_name", namer_.Type(struct_def));
    writer.SetValue("superclass", fixed ? "Struct" : "Table");

    writer += "@Suppress(\"unused\")";
    writer += "class {{struct_name}} : {{superclass}}() {\n";

    writer.IncrementIdentLevel();

    {
      // Generate the __init() method that sets the field in a pre-existing
      // accessor object. This is to allow object reuse.
      GenerateFun(writer, "__init", "_i: Int, _bb: ByteBuffer", "",
                  [&]() { writer += "__reset(_i, _bb)"; });

      // Generate assign method
      GenerateFun(writer, "__assign", "_i: Int, _bb: ByteBuffer",
                  namer_.Type(struct_def), [&]() {
                    writer += "__init(_i, _bb)";
                    writer += "return this";
                  });

      // Generate all getters
      GenerateStructGetters(struct_def, writer);

      // Generate Static Fields
      GenerateCompanionObject(writer, [&]() {
        if (!struct_def.fixed) {
          FieldDef *key_field = nullptr;

          // Generate version check method.
          // Force compile time error if not using the same version
          // runtime.
          GenerateFunOneLine(
              writer, "validateVersion", "", "",
              [&]() { writer += "Constants.FLATBUFFERS_24_3_25()"; },
              options.gen_jvmstatic);

          GenerateGetRootAsAccessors(namer_.Type(struct_def), writer, options);
          GenerateBufferHasIdentifier(struct_def, writer, options);
          GenerateTableCreator(struct_def, writer, options);

          GenerateStartStructMethod(struct_def, writer, options);

          // Static Add for fields
          auto fields = struct_def.fields.vec;
          int field_pos = -1;
          for (auto it = fields.begin(); it != fields.end(); ++it) {
            auto &field = **it;
            field_pos++;
            if (field.deprecated) continue;
            if (field.key) key_field = &field;
            GenerateAddField(NumToString(field_pos), field, writer, options);

            if (IsVector(field.value.type)) {
              auto vector_type = field.value.type.VectorType();
              if (!IsStruct(vector_type)) {
                GenerateCreateVectorField(field, writer, options);
              }
              GenerateStartVectorField(field, writer, options);
            }
          }

          GenerateEndStructMethod(struct_def, writer, options);
          auto file_identifier = parser_.file_identifier_;
          if (parser_.root_struct_def_ == &struct_def) {
            GenerateFinishStructBuffer(struct_def, file_identifier, writer,
                                       options);
            GenerateFinishSizePrefixed(struct_def, file_identifier, writer,
                                       options);
          }

          if (struct_def.has_key) {
            GenerateLookupByKey(key_field, struct_def, writer, options);
          }
        } else {
          GenerateStaticConstructor(struct_def, writer, options);
        }
      });
    }

    // class closing
    writer.DecrementIdentLevel();
    writer += "}";
  }